

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_tuple_management.hpp
# Opt level: O2

void burst::management::manage<(anonymous_namespace)::destructor_counter>
               (operation_t todo,void *source,void *destination)

{
  uint __line;
  pointer_____offset_0x10___ *ppuVar1;
  
  switch(todo) {
  case copy:
  case move:
    ppuVar1 = *source;
    goto LAB_0019020a;
  case destroy:
    if (source != (void *)0x0) {
      __line = 0x56;
LAB_00190273:
      __assert_fail("source == nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/container/detail/dynamic_tuple_management.hpp"
                    ,__line,
                    "void burst::management::manage(operation_t, const void *, void *) [T = (anonymous namespace)::destructor_counter]"
                   );
    }
    **destination = **destination + 1;
    break;
  case size:
    if (source != (void *)0x0) {
      __line = 0x5c;
      goto LAB_00190273;
    }
    *(undefined8 *)destination = 8;
    break;
  case type:
    if (source != (void *)0x0) {
      __line = 0x62;
      goto LAB_00190273;
    }
    ppuVar1 = &(anonymous_namespace)::destructor_counter::typeinfo;
LAB_0019020a:
    *(pointer_____offset_0x10___ **)destination = ppuVar1;
  }
  return;
}

Assistant:

void manage (operation_t todo, const void * source, void * destination)
        {
            switch (todo)
            {
                case operation_t::copy:
                {
                    copy<T>(source, destination);
                    break;
                }
                case operation_t::move:
                {
                    move<T>(const_cast<void *>(source), destination);
                    break;
                }
                case operation_t::destroy:
                {
                    assert(source == nullptr);
                    destroy<T>(destination);
                    break;
                }
                case operation_t::size:
                {
                    assert(source == nullptr);
                    *static_cast<std::size_t *>(destination) = sizeof(T);
                    break;
                }
                case operation_t::type:
                {
                    assert(source == nullptr);
                    *static_cast<const std::type_info **>(destination) = std::addressof(typeid(T));
                    break;
                }
            }
        }